

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O1

void __thiscall Pathie::entry_iterator::open_native_handle(entry_iterator *this)

{
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  ErrnoError *this_00;
  int *piVar3;
  string nstr;
  string local_80;
  string local_60;
  string local_40;
  
  Path::native_abi_cxx11_(&local_40,this->mp_directory);
  __dirp = opendir(local_40._M_dataplus._M_p);
  this->mp_cur = __dirp;
  if (__dirp != (DIR *)0x0) {
    pdVar1 = readdir(__dirp);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar2 = strlen(pdVar1->d_name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,pdVar1->d_name,pdVar1->d_name + sVar2);
    filename_to_utf8(&local_60,&local_80);
    Path::operator=(this->mp_cur_path,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar3 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar3);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void entry_iterator::open_native_handle()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = mp_directory->native();
  mp_cur = opendir(nstr.c_str());

  if (mp_cur) {
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    *mp_cur_path = filename_to_utf8(p_dirent->d_name);
  }
  else {
    throw(Pathie::ErrnoError(errno));
  }
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(mp_directory->str() + "/*");
  WIN32_FIND_DATAW finddata;

  mp_cur = FindFirstFileW(utf16.c_str(), &finddata);
  if (static_cast<HANDLE>(mp_cur) == INVALID_HANDLE_VALUE) {
    DWORD err = GetLastError();
    mp_cur = NULL;
    throw(Pathie::WindowsError(err));
  }
  else {
    *mp_cur_path = utf16_to_utf8(finddata.cFileName);
  }
#else
#error Unsupported system
#endif
}